

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O1

void void_pthread_rwlock_wrlock(void *mu)

{
  int iVar1;
  int *piVar2;
  unique_lock<std::mutex> rw_mu;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = (mutex_type *)(*mu + 8);
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  piVar2 = *mu;
  iVar1 = *piVar2;
  while (iVar1 != 0) {
    std::condition_variable::wait((unique_lock *)(piVar2 + 0xc));
    piVar2 = *mu;
    iVar1 = *piVar2;
  }
  *piVar2 = -1;
  std::unique_lock<std::mutex>::unlock(&local_20);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

static void void_pthread_rwlock_wrlock (void *mu) {
	pthread_rwlock_wrlock ((pthread_rwlock_t *) mu);
}